

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_cleanup(CookieInfo *c)

{
  Cookie *pCVar1;
  Cookie *co;
  
  if (c == (CookieInfo *)0x0) {
    return;
  }
  if (c->filename != (char *)0x0) {
    (*Curl_cfree)(c->filename);
  }
  co = c->cookies;
  while (co != (Cookie *)0x0) {
    pCVar1 = co->next;
    freecookie(co);
    co = pCVar1;
  }
  (*Curl_cfree)(c);
  return;
}

Assistant:

void Curl_cookie_cleanup(struct CookieInfo *c)
{
  struct Cookie *co;
  struct Cookie *next;
  if(c) {
    if(c->filename)
      free(c->filename);
    co = c->cookies;

    while(co) {
      next = co->next;
      freecookie(co);
      co = next;
    }
    free(c); /* free the base struct as well */
  }
}